

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

void dg::DOD::constructTernaryRelation
               (ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,CDNode *b2,CDNode *b3,CDNode *r1
               ,CDNode *r2)

{
  pointer ppCVar1;
  bool bVar2;
  iterator iVar3;
  _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
  *p_Var4;
  CDNode *pCVar5;
  CDNode *gncur;
  CDNode *gcur;
  CDNode *local_68;
  ColoringT *local_60;
  ColoringT *local_58;
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  CDNode *local_48;
  key_type local_40;
  CDNode *local_38;
  
  local_50 = &(CAp->_rev_mapping)._M_h;
  local_58 = &CAp->blues;
  local_60 = &CAp->reds;
  local_38 = p;
  do {
    local_68 = b2;
    iVar3 = std::
            _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_50,&local_68);
    pCVar5 = r2;
    local_48 = b2;
    if (iVar3.super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>._M_cur ==
        (__node_type *)0x0) {
      local_40 = (key_type)0x0;
    }
    else {
      local_40 = *(key_type *)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>
                         ._M_cur + 0x10);
    }
    do {
      local_68 = pCVar5;
      iVar3 = std::
              _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_50,&local_68);
      if (iVar3.super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>._M_cur
          == (__node_type *)0x0) {
        local_68 = (key_type)0x0;
      }
      else {
        local_68 = *(CDNode **)
                    ((long)iVar3.
                           super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>
                           ._M_cur + 0x10);
      }
      p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](CD,&local_40);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_38);
      p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](CD,&local_68);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_38);
      p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](revCD,&local_38);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_40);
      p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](revCD,&local_38);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_68);
      ppCVar1 = (pCVar5->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((long)ppCVar1 -
          (long)(pCVar5->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        pCVar5 = ppCVar1[-1];
      }
      else {
        pCVar5 = (CDNode *)0x0;
      }
      bVar2 = ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
              ::get(local_58,(ulong)pCVar5->_id);
    } while ((!bVar2) &&
            (bVar2 = ADT::
                     SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                     ::get(local_60,(ulong)pCVar5->_id), !bVar2));
    ppCVar1 = (local_48->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppCVar1 -
        (long)(local_48->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      b2 = ppCVar1[-1];
    }
    else {
      b2 = (CDNode *)0x0;
    }
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(local_58,(ulong)b2->_id);
  } while ((!bVar2) &&
          (bVar2 = ADT::
                   SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                   ::get(local_60,(ulong)b2->_id), !bVar2));
  return;
}

Assistant:

static void constructTernaryRelation(ColoredAp &CAp, CDNode *p, ResultT &CD,
                                         ResultT &revCD, CDNode *b2, CDNode *b3,
                                         CDNode *r1, CDNode *r2) {
        auto *cur = b2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);

            auto *ncur = r2;
            do {
                auto *gncur = CAp.getGNode(ncur);
                assert(gncur);
                // DBG(cda, p->getID() << " - dod -> {" << gcur->getID() << ", "
                //                                     << gncur->getID() <<
                //                                     "}");

                CD[gcur].insert(p);
                CD[gncur].insert(p);
                revCD[p].insert(gcur);
                revCD[p].insert(gncur);

                ncur = ncur->getSingleSuccessor();
            } while (!(CAp.isBlue(ncur) || CAp.isRed(ncur)));
            assert(ncur == b3);
            (void) b3;

            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == r1);
        (void) r1;
    }